

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O1

ncnn_mat_t
ncnn_mat_create_external_3d_elem
          (int w,int h,int c,void *data,size_t elemsize,int elempack,ncnn_allocator_t allocator)

{
  ncnn_mat_t p_Var1;
  void *pvVar2;
  
  p_Var1 = (ncnn_mat_t)operator_new(0x48);
  if (allocator == (ncnn_allocator_t)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = allocator->pthis;
  }
  *(void **)p_Var1 = data;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(size_t *)(p_Var1 + 0x10) = elemsize;
  *(int *)(p_Var1 + 0x18) = elempack;
  *(void **)(p_Var1 + 0x20) = pvVar2;
  *(undefined4 *)(p_Var1 + 0x28) = 3;
  *(int *)(p_Var1 + 0x2c) = w;
  *(int *)(p_Var1 + 0x30) = h;
  *(undefined4 *)(p_Var1 + 0x34) = 1;
  *(int *)(p_Var1 + 0x38) = c;
  *(ulong *)(p_Var1 + 0x40) = ((long)h * (long)w * elemsize + 0xf & 0xfffffffffffffff0) / elemsize;
  return p_Var1;
}

Assistant:

ncnn_mat_t ncnn_mat_create_external_3d_elem(int w, int h, int c, void* data, size_t elemsize, int elempack, ncnn_allocator_t allocator)
{
    return (ncnn_mat_t)(new Mat(w, h, c, data, elemsize, elempack, allocator ? (Allocator*)allocator->pthis : NULL));
}